

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::Apply<float,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  int iVar4;
  float *val;
  float fVar5;
  float fVar6;
  float fVar7;
  VecAccum<float,_4> local_45;
  float local_44;
  float local_40;
  float local_3c;
  void *local_38;
  
  fVar6 = k->A + k->A;
  local_44 = fVar6;
  local_38 = data;
  for (iVar4 = k->v1; iVar4 != k->v2; iVar4 = iVar4 + 1) {
    iVar1 = k->rowlen - iVar4;
    iVar2 = iVar1 - k->w2;
    if (iVar2 < k->u1) {
      iVar2 = k->u1;
    }
    iVar1 = iVar1 - k->w1;
    if (k->u2 < iVar1) {
      iVar1 = k->u2;
    }
    fVar7 = (float)iVar2 - k->u;
    fVar5 = (float)iVar4 - k->v;
    local_40 = (fVar7 + fVar7 + 1.0) * k->A + fVar5 * k->B;
    local_3c = k->A * fVar7 * fVar7 + (k->B * fVar7 + k->C * fVar5) * fVar5;
    val = (float *)((long)local_38 + (long)((k->rowlen * iVar4 + iVar2) * 4) * 4);
    pfVar3 = val + (iVar1 - iVar2) * 4;
    for (; val < pfVar3; val = val + 4) {
      if (local_3c < 1.0) {
        fVar6 = anon_unknown_2::gaussian(local_3c);
        fVar6 = fVar6 * k->wscale;
        k->weight = k->weight + fVar6;
        PtexUtils::VecAccum<float,_4>::operator()(&local_45,result,val,fVar6);
        fVar6 = local_44;
      }
      local_3c = local_3c + local_40;
      local_40 = local_40 + fVar6;
    }
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }